

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::TraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  uint sourceContextId;
  bool bVar1;
  LocalFunctionId functionId;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,ExecutionModePhase,sourceContextId,functionId);
  if (bVar1) {
    DoTraceExecutionMode(this,eventDescription);
    return;
  }
  return;
}

Assistant:

void FunctionBody::TraceExecutionMode(const char *const eventDescription) const
    {
        executionState.AssertIsInitialized();

        if(PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            DoTraceExecutionMode(eventDescription);
        }
    }